

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O0

void __thiscall
YAML::SingleDocParser::ParseAnchor(SingleDocParser *this,anchor_t *anchor,string *anchor_name)

{
  undefined8 uVar1;
  anchor_t aVar2;
  string *in_RDX;
  anchor_t *in_RSI;
  ParserException *in_RDI;
  Token *token;
  Scanner *in_stack_ffffffffffffff90;
  string *msg_;
  SingleDocParser *in_stack_ffffffffffffff98;
  Mark *mark_;
  undefined1 local_41 [33];
  Token *local_20;
  string *local_18;
  anchor_t *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = Scanner::peek(in_stack_ffffffffffffff90);
  if (*local_10 != 0) {
    uVar1 = __cxa_allocate_exception(0x40);
    msg_ = (string *)&local_20->mark;
    mark_ = (Mark *)local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_41 + 1),"cannot assign multiple anchors to the same node",
               (allocator *)mark_);
    ParserException::ParserException(in_RDI,mark_,msg_);
    __cxa_throw(uVar1,&ParserException::typeinfo,ParserException::~ParserException);
  }
  std::__cxx11::string::operator=(local_18,(string *)&local_20->value);
  aVar2 = RegisterAnchor(in_stack_ffffffffffffff98,(string *)in_stack_ffffffffffffff90);
  *local_10 = aVar2;
  Scanner::pop(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void SingleDocParser::ParseAnchor(anchor_t& anchor, std::string& anchor_name) {
  Token& token = m_scanner.peek();
  if (anchor)
    throw ParserException(token.mark, ErrorMsg::MULTIPLE_ANCHORS);

  anchor_name = token.value;
  anchor = RegisterAnchor(token.value);
  m_scanner.pop();
}